

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O0

int picnic_impl_verify(picnic_instance_t *pp,picnic_context_t *context,uint8_t *sig,size_t siglen)

{
  ushort uVar1;
  sig_proof_t *psVar2;
  int iVar3;
  view_t *__ptr;
  rvec_t *__ptr_00;
  ushort *__ptr_01;
  void *__ptr_02;
  picnic_instance_t *ppVar4;
  uint uVar5;
  uint uVar6;
  mzd_local_t *in_RSI;
  view_t *in_RDI;
  int success_status;
  uchar challenge [438];
  uint j_10;
  uint j_9;
  uint j_8;
  uint8_t tape_bytes [143];
  uint j_7;
  uint player_number_1;
  _Bool include_input_size_1;
  uint j_6;
  kdf_shake_t kdfs_1 [2];
  proof_round_t *round_1;
  uint c_i_1;
  uint b_i_1;
  uint a_i_1;
  uint j_5;
  uint j_4;
  uint j_3;
  uint j_2;
  proof_round_t *round;
  uint round_offset;
  uint j_1;
  uint8_t *seeds [4];
  uint player_number;
  _Bool include_input_size;
  uint j;
  uint16_t round_numbers [4];
  kdf_shake_x4_t kdfs [2];
  proof_round_t *prf3;
  proof_round_t *prf2;
  proof_round_t *prf1;
  proof_round_t *prf0;
  uint c_i;
  uint b_i;
  uint a_i;
  sorting_helper_t *helper;
  uint i;
  uint r;
  uint num_current_rounds;
  uint current_chal;
  uint8_t *tape_bytes_x4;
  sorting_helper_t *sorted_rounds;
  rvec_t *rvec;
  view_t *views;
  in_out_shares_t in_out_shares;
  zkbpp_lowmc_verify_implementation_f lowmc_verify_impl;
  uint diff;
  uint aview_size;
  uint view_size;
  uint input_output_size;
  uint num_rounds;
  sig_proof_t *prf;
  view_t *in_stack_fffffffffffff320;
  hash_context *in_stack_fffffffffffff328;
  picnic_instance_t *in_stack_fffffffffffff330;
  rvec_t *in_stack_fffffffffffff338;
  undefined4 in_stack_fffffffffffff340;
  undefined2 in_stack_fffffffffffff344;
  undefined1 in_stack_fffffffffffff346;
  undefined1 in_stack_fffffffffffff347;
  view_t *in_stack_fffffffffffff348;
  picnic_instance_t *in_stack_fffffffffffff350;
  undefined4 in_stack_fffffffffffff358;
  uint in_stack_fffffffffffff35c;
  uint in_stack_fffffffffffff360;
  undefined1 in_stack_fffffffffffff364;
  undefined1 in_stack_fffffffffffff365;
  undefined1 in_stack_fffffffffffff366;
  undefined1 in_stack_fffffffffffff367;
  view_t *in_stack_fffffffffffff368;
  undefined1 local_c70 [3];
  undefined1 in_stack_fffffffffffff393;
  uint16_t in_stack_fffffffffffff394;
  uint16_t in_stack_fffffffffffff396;
  uint8_t *in_stack_fffffffffffff398;
  uint8_t *in_stack_fffffffffffff3a0;
  kdf_shake_t *in_stack_fffffffffffff3a8;
  picnic_instance_t *in_stack_fffffffffffff3b0;
  picnic_instance_t *in_stack_fffffffffffff3b8;
  uint in_stack_fffffffffffff43c;
  proof_round_t *in_stack_fffffffffffff440;
  undefined5 in_stack_fffffffffffff448;
  undefined1 in_stack_fffffffffffff44d;
  uint16_t in_stack_fffffffffffff44e;
  uint16_t *in_stack_fffffffffffff450;
  undefined4 in_stack_fffffffffffff458;
  uint in_stack_fffffffffffff45c;
  proof_round_t *in_stack_fffffffffffff460;
  kdf_shake_x4_t *in_stack_fffffffffffff468;
  picnic_instance_t *in_stack_fffffffffffff478;
  uint8_t *in_stack_fffffffffffff480;
  picnic_context_t *in_stack_fffffffffffff488;
  sig_proof_t *in_stack_fffffffffffff490;
  picnic_instance_t *in_stack_fffffffffffff498;
  uint local_aac;
  uint local_aa8;
  uint local_aa4;
  uint local_a10;
  uint local_a04;
  uint in_stack_fffffffffffff774;
  sorting_helper_t *in_stack_fffffffffffff778;
  proof_round_t *in_stack_fffffffffffff780;
  picnic_instance_t *in_stack_fffffffffffff788;
  undefined1 in_stack_fffffffffffff793;
  uint in_stack_fffffffffffff794;
  sorting_helper_t *in_stack_fffffffffffff798;
  proof_round_t *in_stack_fffffffffffff7a0;
  picnic_instance_t *in_stack_fffffffffffff7a8;
  uint local_820;
  uint local_81c;
  uint local_818;
  uint local_814;
  uint local_808;
  uint local_804;
  uint local_7cc;
  ushort *local_118;
  uint local_110;
  uint local_10c;
  uint local_108;
  uint local_104;
  in_out_shares_t local_e0;
  zkbpp_lowmc_verify_implementation_f local_80;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  sig_proof_t *local_60;
  mzd_local_t *local_48;
  view_t *local_40;
  int local_34;
  
  local_48 = in_RSI;
  local_40 = in_RDI;
  local_60 = sig_proof_from_char_array
                       (in_stack_fffffffffffff3b0,(picnic_context_t *)in_stack_fffffffffffff3a8,
                        in_stack_fffffffffffff3a0,(size_t)in_stack_fffffffffffff398);
  if (local_60 == (sig_proof_t *)0x0) {
    local_34 = -1;
  }
  else {
    local_64 = (uint)*(ushort *)((long)local_40->s[0].w64 + 4);
    local_68 = (uint)(byte)local_40->t[1];
    local_6c = (uint)*(byte *)((long)local_40->s[0].w64 + 9);
    local_70 = local_6c + 7 & 0xfffffff8;
    local_74 = local_68 * 8 - (uint)*(ushort *)local_40;
    local_80 = get_zkbpp_lowmc_verify_implementation(&in_stack_fffffffffffff330->lowmc);
    __ptr = (view_t *)aligned_alloc(0x20,(ulong)*(byte *)((long)local_40->s[0].w64 + 3) * 0x60);
    __ptr_00 = (rvec_t *)aligned_alloc(0x20,(ulong)*(byte *)((long)local_40->s[0].w64 + 3) * 0x60);
    __ptr_01 = (ushort *)malloc((ulong)local_64 << 1);
    __ptr_02 = (void *)aligned_alloc(8);
    for (local_104 = 0; local_104 < 3; local_104 = local_104 + 1) {
      local_108 = 0;
      for (local_10c = 0; local_10c < local_64; local_10c = local_10c + 1) {
        if (local_60->challenge[local_10c] == local_104) {
          __ptr_01[local_108] = (ushort)local_10c;
          local_108 = local_108 + 1;
        }
      }
      local_118 = __ptr_01;
      for (local_110 = 0; local_110 < (local_108 & 0xfffffffc); local_110 = local_110 + 4) {
        uVar5 = (local_104 + 1) % 3;
        uVar6 = (local_104 + 2) % 3;
        for (local_7cc = 0; local_7cc < 2; local_7cc = local_7cc + 1) {
          in_stack_fffffffffffff320 = local_40;
          kdf_init_x4_from_seed
                    (in_stack_fffffffffffff468,in_stack_fffffffffffff460->seeds,
                     (uint8_t *)CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458),
                     in_stack_fffffffffffff450,in_stack_fffffffffffff44e,
                     (_Bool)in_stack_fffffffffffff44d,in_stack_fffffffffffff478);
        }
        if (uVar5 != 0) {
          hash_squeeze_x4_4((hash_context_x4 *)in_stack_fffffffffffff368->s,
                            (uint8_t *)
                            CONCAT17(in_stack_fffffffffffff367,
                                     CONCAT16(in_stack_fffffffffffff366,
                                              CONCAT15(in_stack_fffffffffffff365,
                                                       CONCAT14(in_stack_fffffffffffff364,
                                                                in_stack_fffffffffffff360)))),
                            (uint8_t *)CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358)
                            ,(uint8_t *)in_stack_fffffffffffff350,
                            (uint8_t *)in_stack_fffffffffffff348->t,
                            CONCAT17(in_stack_fffffffffffff347,
                                     CONCAT16(in_stack_fffffffffffff346,
                                              CONCAT24(in_stack_fffffffffffff344,
                                                       in_stack_fffffffffffff340))));
        }
        if (uVar6 != 0) {
          hash_squeeze_x4_4((hash_context_x4 *)in_stack_fffffffffffff368->s,
                            (uint8_t *)
                            CONCAT17(in_stack_fffffffffffff367,
                                     CONCAT16(in_stack_fffffffffffff366,
                                              CONCAT15(in_stack_fffffffffffff365,
                                                       CONCAT14(in_stack_fffffffffffff364,
                                                                in_stack_fffffffffffff360)))),
                            (uint8_t *)CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358)
                            ,(uint8_t *)in_stack_fffffffffffff350,
                            (uint8_t *)in_stack_fffffffffffff348->t,
                            CONCAT17(in_stack_fffffffffffff347,
                                     CONCAT16(in_stack_fffffffffffff346,
                                              CONCAT24(in_stack_fffffffffffff344,
                                                       in_stack_fffffffffffff340))));
        }
        for (local_804 = 0; local_804 < 2; local_804 = local_804 + 1) {
          hash_squeeze_x4_4((hash_context_x4 *)in_stack_fffffffffffff368->s,
                            (uint8_t *)
                            CONCAT17(in_stack_fffffffffffff367,
                                     CONCAT16(in_stack_fffffffffffff366,
                                              CONCAT15(in_stack_fffffffffffff365,
                                                       CONCAT14(in_stack_fffffffffffff364,
                                                                in_stack_fffffffffffff360)))),
                            (uint8_t *)CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358)
                            ,(uint8_t *)in_stack_fffffffffffff350,
                            (uint8_t *)in_stack_fffffffffffff348->t,
                            CONCAT17(in_stack_fffffffffffff347,
                                     CONCAT16(in_stack_fffffffffffff346,
                                              CONCAT24(in_stack_fffffffffffff344,
                                                       in_stack_fffffffffffff340))));
        }
        for (local_808 = 0; psVar2 = local_60, local_808 < 4; local_808 = local_808 + 1) {
          uVar1 = local_118[local_808];
          if (uVar5 != 0) {
            clear_padding_bits((uint8_t *)
                               (*(long *)((long)local_60 + (ulong)uVar1 * 0x90 + 0x58) +
                               (ulong)(local_68 - 1)),local_74);
          }
          mzd_from_char_array((mzd_local_t *)
                              CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358),
                              (uint8_t *)in_stack_fffffffffffff350,(size_t)in_stack_fffffffffffff348
                             );
          if (uVar6 != 0) {
            clear_padding_bits((uint8_t *)
                               (*(long *)((long)psVar2 + (ulong)uVar1 * 0x90 + 0x60) +
                               (ulong)(local_68 - 1)),local_74);
          }
          mzd_from_char_array((mzd_local_t *)
                              CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358),
                              (uint8_t *)in_stack_fffffffffffff350,(size_t)in_stack_fffffffffffff348
                             );
          for (local_814 = 0; local_814 < 2; local_814 = local_814 + 1) {
            decompress_random_tape
                      (in_stack_fffffffffffff338,in_stack_fffffffffffff330,
                       (uint8_t *)in_stack_fffffffffffff328,
                       (uint)((ulong)in_stack_fffffffffffff320 >> 0x20));
          }
          decompress_view((view_t *)CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358),
                          in_stack_fffffffffffff350,(uint8_t *)in_stack_fffffffffffff348->t,
                          CONCAT13(in_stack_fffffffffffff347,
                                   CONCAT12(in_stack_fffffffffffff346,in_stack_fffffffffffff344)));
          (*local_80)(local_48,__ptr,&local_e0,__ptr_00,local_104);
          compress_view((uint8_t *)CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358),
                        in_stack_fffffffffffff350,in_stack_fffffffffffff348,
                        CONCAT13(in_stack_fffffffffffff347,
                                 CONCAT12(in_stack_fffffffffffff346,in_stack_fffffffffffff344)));
          mzd_share((lowmc_parameters_t *)in_stack_fffffffffffff338->s,
                    (mzd_local_t *)in_stack_fffffffffffff330,
                    (mzd_local_t *)in_stack_fffffffffffff328,in_stack_fffffffffffff320->s,
                    (mzd_local_t *)0x13ede9);
          for (local_818 = 0; local_818 < 2; local_818 = local_818 + 1) {
            mzd_to_char_array((uint8_t *)
                              CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358),
                              (mzd_local_t *)in_stack_fffffffffffff350,
                              (size_t)in_stack_fffffffffffff348);
          }
          mzd_to_char_array((uint8_t *)CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358)
                            ,(mzd_local_t *)in_stack_fffffffffffff350,
                            (size_t)in_stack_fffffffffffff348);
        }
        for (local_81c = 0; local_81c < 2; local_81c = local_81c + 1) {
          hash_commitment_x4_verify
                    (in_stack_fffffffffffff788,in_stack_fffffffffffff780,in_stack_fffffffffffff778,
                     in_stack_fffffffffffff774);
        }
        if ((local_48[3].w64[1] & 1) != 0) {
          for (local_820 = 0; local_820 < 2; local_820 = local_820 + 1) {
            if ((local_104 != 1) || (in_stack_fffffffffffff367 = true, local_820 != 1)) {
              in_stack_fffffffffffff366 = local_104 == 2 && local_820 == 0;
              in_stack_fffffffffffff367 = in_stack_fffffffffffff366;
            }
            in_stack_fffffffffffff368 = local_40;
            unruh_G_x4_verify(in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                              in_stack_fffffffffffff798,in_stack_fffffffffffff794,
                              (_Bool)in_stack_fffffffffffff793);
          }
        }
        local_118 = local_118 + 4;
      }
      for (; local_110 < local_108; local_110 = local_110 + 1) {
        uVar5 = (local_104 + 1) % 3;
        uVar6 = (local_104 + 2) % 3;
        ppVar4 = (picnic_instance_t *)((long)local_60 + (ulong)*local_118 * 0x90 + 0x28);
        for (local_a04 = 0; local_a04 < 2; local_a04 = local_a04 + 1) {
          if ((local_a04 != 0) || (in_stack_fffffffffffff365 = true, uVar5 == 0)) {
            in_stack_fffffffffffff364 = local_a04 == 1 && uVar6 != 0;
            in_stack_fffffffffffff365 = in_stack_fffffffffffff364;
          }
          in_stack_fffffffffffff360 = uVar5;
          if (local_a04 == 0) {
            in_stack_fffffffffffff360 = local_104;
          }
          in_stack_fffffffffffff320 = local_40;
          kdf_init_from_seed(in_stack_fffffffffffff3a8,in_stack_fffffffffffff3a0,
                             in_stack_fffffffffffff398,in_stack_fffffffffffff396,
                             in_stack_fffffffffffff394,(_Bool)in_stack_fffffffffffff393,
                             in_stack_fffffffffffff3b8);
        }
        if (uVar5 != 0) {
          hash_squeeze(in_stack_fffffffffffff328,(uint8_t *)in_stack_fffffffffffff320->t,0x13f1a8);
          clear_padding_bits((uint8_t *)(*(long *)(ppVar4 + 4) + (ulong)(local_68 - 1)),local_74);
        }
        if (uVar6 != 0) {
          hash_squeeze(in_stack_fffffffffffff328,(uint8_t *)in_stack_fffffffffffff320->t,0x13f202);
          clear_padding_bits((uint8_t *)
                             (*(long *)&ppVar4[4].input_output_size + (ulong)(local_68 - 1)),
                             local_74);
        }
        mzd_from_char_array((mzd_local_t *)
                            CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358),
                            (uint8_t *)in_stack_fffffffffffff350,(size_t)in_stack_fffffffffffff348);
        mzd_from_char_array((mzd_local_t *)
                            CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358),
                            (uint8_t *)in_stack_fffffffffffff350,(size_t)in_stack_fffffffffffff348);
        for (local_a10 = 0; local_a10 < 2; local_a10 = local_a10 + 1) {
          hash_squeeze(in_stack_fffffffffffff328,(uint8_t *)in_stack_fffffffffffff320->t,0x13f2b5);
          decompress_random_tape
                    (in_stack_fffffffffffff338,in_stack_fffffffffffff330,
                     (uint8_t *)in_stack_fffffffffffff328,
                     (uint)((ulong)in_stack_fffffffffffff320 >> 0x20));
        }
        for (local_aa4 = 0; local_aa4 < 2; local_aa4 = local_aa4 + 1) {
        }
        decompress_view((view_t *)CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358),
                        in_stack_fffffffffffff350,(uint8_t *)in_stack_fffffffffffff348->t,
                        CONCAT13(in_stack_fffffffffffff347,
                                 CONCAT12(in_stack_fffffffffffff346,in_stack_fffffffffffff344)));
        (*local_80)(local_48,__ptr,&local_e0,__ptr_00,local_104);
        compress_view((uint8_t *)CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358),
                      in_stack_fffffffffffff350,in_stack_fffffffffffff348,
                      CONCAT13(in_stack_fffffffffffff347,
                               CONCAT12(in_stack_fffffffffffff346,in_stack_fffffffffffff344)));
        mzd_share((lowmc_parameters_t *)in_stack_fffffffffffff338->s,
                  (mzd_local_t *)in_stack_fffffffffffff330,(mzd_local_t *)in_stack_fffffffffffff328,
                  in_stack_fffffffffffff320->s,(mzd_local_t *)0x13f3ca);
        for (local_aa8 = 0; local_aa8 < 2; local_aa8 = local_aa8 + 1) {
          mzd_to_char_array((uint8_t *)CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358)
                            ,(mzd_local_t *)in_stack_fffffffffffff350,
                            (size_t)in_stack_fffffffffffff348);
          hash_commitment((picnic_instance_t *)
                          CONCAT26(in_stack_fffffffffffff44e,
                                   CONCAT15(in_stack_fffffffffffff44d,in_stack_fffffffffffff448)),
                          in_stack_fffffffffffff440,in_stack_fffffffffffff43c);
        }
        mzd_to_char_array((uint8_t *)CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358),
                          (mzd_local_t *)in_stack_fffffffffffff350,(size_t)in_stack_fffffffffffff348
                         );
        if ((local_48[3].w64[1] & 1) != 0) {
          for (local_aac = 0; local_aac < 2; local_aac = local_aac + 1) {
            if ((local_104 != 1) || (in_stack_fffffffffffff347 = true, local_aac != 1)) {
              in_stack_fffffffffffff346 = local_104 == 2 && local_aac == 0;
              in_stack_fffffffffffff347 = in_stack_fffffffffffff346;
            }
            in_stack_fffffffffffff348 = local_40;
            in_stack_fffffffffffff350 = ppVar4;
            in_stack_fffffffffffff35c = local_aac;
            unruh_G((picnic_instance_t *)in_stack_fffffffffffff468,in_stack_fffffffffffff460,
                    in_stack_fffffffffffff45c,SUB41((uint)in_stack_fffffffffffff458 >> 0x18,0));
          }
        }
        local_118 = local_118 + 1;
      }
    }
    memset(local_c70,0,0x1b6);
    H3_verify(in_stack_fffffffffffff498,in_stack_fffffffffffff490,in_stack_fffffffffffff488,
              in_stack_fffffffffffff480);
    iVar3 = memcmp(local_c70,local_60->challenge,(ulong)*(ushort *)((long)local_40->s[0].w64 + 4));
    free(__ptr_02);
    free(__ptr_01);
    free(__ptr_00);
    free(__ptr);
    proof_free((sig_proof_t *)0x13f612);
    local_34 = iVar3;
  }
  return local_34;
}

Assistant:

int picnic_impl_verify(const picnic_instance_t* pp, const picnic_context_t* context,
                       const uint8_t* sig, size_t siglen) {
  sig_proof_t* prf = sig_proof_from_char_array(pp, context, sig, siglen);
  if (!prf) {
    return -1;
  }

  const unsigned int num_rounds        = pp->num_rounds;
  const unsigned int input_output_size = pp->input_output_size;
  const unsigned int view_size         = pp->view_size;
  const unsigned int aview_size        = ALIGNU64T(view_size);
  const unsigned int diff              = input_output_size * 8 - pp->lowmc.n;

  const zkbpp_lowmc_verify_implementation_f lowmc_verify_impl =
      get_zkbpp_lowmc_verify_implementation(&pp->lowmc);

  in_out_shares_t in_out_shares;
  view_t* views = picnic_aligned_alloc(32, sizeof(view_t) * pp->lowmc.r);
  rvec_t* rvec =
      picnic_aligned_alloc(32, sizeof(rvec_t) * pp->lowmc.r); // random tapes for and-gates

  // sort the different challenge rounds based on their H3 index, so we can use the 4x Keccak when
  // verifying since all of this is public information, there is no leakage
  sorting_helper_t* sorted_rounds = malloc(sizeof(sorting_helper_t) * num_rounds);

  uint8_t* tape_bytes_x4 = picnic_aligned_alloc(sizeof(uint64_t), SC_VERIFY * 4 * aview_size);
  for (unsigned int current_chal = 0; current_chal < 3; current_chal++) {
    unsigned int num_current_rounds = 0;
    for (unsigned int r = 0; r < num_rounds; r++) {
      if (prf->challenge[r] == current_chal) {
        sorted_rounds[num_current_rounds++] = r;
      }
    }
    unsigned int i                 = 0;
    const sorting_helper_t* helper = sorted_rounds;
    for (; i < (num_current_rounds / 4) * 4; i += 4, helper += 4) {
      const unsigned int a_i = current_chal;
      const unsigned int b_i = (a_i + 1) % 3;
      const unsigned int c_i = (a_i + 2) % 3;

      const proof_round_t* prf0 = &prf->round[helper[0]];
      const proof_round_t* prf1 = &prf->round[helper[1]];
      const proof_round_t* prf2 = &prf->round[helper[2]];
      const proof_round_t* prf3 = &prf->round[helper[3]];

      {
        kdf_shake_x4_t kdfs[SC_VERIFY];
        const uint16_t round_numbers[4] = {helper[0], helper[1], helper[2], helper[3]};
        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          const bool include_input_size    = (j == 0 && b_i) || (j == 1 && c_i);
          const unsigned int player_number = (j == 0) ? a_i : b_i;
          const uint8_t* seeds[4]          = {prf0->seeds[j], prf1->seeds[j], prf2->seeds[j],
                                              prf3->seeds[j]};
          kdf_init_x4_from_seed(&kdfs[j], seeds, prf->salt, round_numbers, player_number,
                                include_input_size, pp);
        }

        // compute input shares if necessary
        if (b_i) {
          kdf_shake_x4_get_randomness_4(&kdfs[0], prf0->input_shares[0], prf1->input_shares[0],
                                        prf2->input_shares[0], prf3->input_shares[0],
                                        input_output_size);
        }
        if (c_i) {
          kdf_shake_x4_get_randomness_4(&kdfs[1], prf0->input_shares[1], prf1->input_shares[1],
                                        prf2->input_shares[1], prf3->input_shares[1],
                                        input_output_size);
        }
        // compute random tapes
        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          kdf_shake_x4_get_randomness_4(&kdfs[j], &tape_bytes_x4[(j * 4 + 0) * aview_size],
                                        &tape_bytes_x4[(j * 4 + 1) * aview_size],
                                        &tape_bytes_x4[(j * 4 + 2) * aview_size],
                                        &tape_bytes_x4[(j * 4 + 3) * aview_size], view_size);
          kdf_shake_x4_clear(&kdfs[j]);
        }
      }

      for (unsigned int round_offset = 0; round_offset < 4; round_offset++) {
        proof_round_t* round = &prf->round[helper[round_offset]];

        if (b_i) {
          clear_padding_bits(&round->input_shares[0][input_output_size - 1], diff);
        }
        mzd_from_char_array(in_out_shares.s[0], round->input_shares[0], input_output_size);
        if (c_i) {
          clear_padding_bits(&round->input_shares[1][input_output_size - 1], diff);
        }
        mzd_from_char_array(in_out_shares.s[1], round->input_shares[1], input_output_size);

        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          decompress_random_tape(rvec, pp, &tape_bytes_x4[(j * 4 + round_offset) * aview_size], j);
        }

        decompress_view(views, pp, round->communicated_bits[1], 1);
        // perform ZKB++ LowMC evaluation
        lowmc_verify_impl(context->m_plaintext, views, &in_out_shares, rvec, a_i);
        compress_view(round->communicated_bits[0], pp, views, 0);

        mzd_share(&pp->lowmc, in_out_shares.s[2], in_out_shares.s[0], in_out_shares.s[1],
                  context->m_key);
        // recompute commitments
        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          mzd_to_char_array(round->output_shares[j], in_out_shares.s[j], input_output_size);
        }
        mzd_to_char_array(round->output_shares[SC_VERIFY], in_out_shares.s[SC_VERIFY],
                          input_output_size);
      }
      for (unsigned int j = 0; j < SC_VERIFY; ++j) {
        hash_commitment_x4_verify(pp, prf->round, helper, j);
      }
#if defined(WITH_UNRUH)
      if (context->unruh) {
        // apply Unruh G permutation
        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          unruh_G_x4_verify(pp, prf->round, helper, j,
                            (a_i == 1 && j == 1) || (a_i == 2 && j == 0));
        }
      }
#endif
    }
    for (; i < num_current_rounds; ++i, ++helper) {
      const unsigned int a_i = current_chal;
      const unsigned int b_i = (a_i + 1) % 3;
      const unsigned int c_i = (a_i + 2) % 3;

      proof_round_t* round = &prf->round[*helper];
      {
        kdf_shake_t kdfs[SC_VERIFY];
        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          const bool include_input_size    = (j == 0 && b_i) || (j == 1 && c_i);
          const unsigned int player_number = (j == 0) ? a_i : b_i;
          kdf_init_from_seed(&kdfs[j], round->seeds[j], prf->salt, *helper, player_number,
                             include_input_size, pp);
        }

        // compute input shares if necessary
        if (b_i) {
          kdf_shake_get_randomness(&kdfs[0], round->input_shares[0], input_output_size);
          clear_padding_bits(&round->input_shares[0][input_output_size - 1], diff);
        }
        if (c_i) {
          kdf_shake_get_randomness(&kdfs[1], round->input_shares[1], input_output_size);
          clear_padding_bits(&round->input_shares[1][input_output_size - 1], diff);
        }

        mzd_from_char_array(in_out_shares.s[0], round->input_shares[0], input_output_size);
        mzd_from_char_array(in_out_shares.s[1], round->input_shares[1], input_output_size);

        // compute random tapes
        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          assert(view_size <= MAX_VIEW_SIZE);
          uint8_t tape_bytes[MAX_VIEW_SIZE];
          kdf_shake_get_randomness(&kdfs[j], tape_bytes, view_size);
          decompress_random_tape(rvec, pp, tape_bytes, j);
        }

        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          kdf_shake_clear(&kdfs[j]);
        }
      }

      decompress_view(views, pp, round->communicated_bits[1], 1);
      // perform ZKB++ LowMC evaluation
      lowmc_verify_impl(context->m_plaintext, views, &in_out_shares, rvec, a_i);
      compress_view(round->communicated_bits[0], pp, views, 0);

      mzd_share(&pp->lowmc, in_out_shares.s[2], in_out_shares.s[0], in_out_shares.s[1],
                context->m_key);
      // recompute commitments
      for (unsigned int j = 0; j < SC_VERIFY; ++j) {
        mzd_to_char_array(round->output_shares[j], in_out_shares.s[j], input_output_size);
        hash_commitment(pp, round, j);
      }
      mzd_to_char_array(round->output_shares[SC_VERIFY], in_out_shares.s[SC_VERIFY],
                        input_output_size);

#if defined(WITH_UNRUH)
      if (context->unruh) {
        // apply Unruh G permutation
        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          unruh_G(pp, round, j, (a_i == 1 && j == 1) || (a_i == 2 && j == 0));
        }
      }
#endif
    }
  }

  assert(pp->num_rounds <= MAX_NUM_ROUNDS);
  unsigned char challenge[MAX_NUM_ROUNDS] = {0};
  H3_verify(pp, prf, context, challenge);
  const int success_status = memcmp(challenge, prf->challenge, pp->num_rounds);

  // clean up
  picnic_aligned_free(tape_bytes_x4);
  free(sorted_rounds);
  picnic_aligned_free(rvec);
  picnic_aligned_free(views);

  proof_free(prf);

  return success_status;
}